

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# special_functions.hpp
# Opt level: O1

longdouble *
trng::math::detail::inv_erfc<long_double>(longdouble *__return_storage_ptr__,longdouble x)

{
  ulong uVar1;
  longdouble *plVar2;
  bool bVar3;
  longdouble in_ST0;
  longdouble in_ST1;
  longdouble lVar4;
  longdouble in_ST2;
  long local_38;
  ushort uStack_30;
  long local_28;
  ushort uStack_20;
  
  lVar4 = (longdouble)1;
  if (lVar4 <= x || x != lVar4) {
    x = lVar4 - (-lVar4 + x);
  }
  inv_Phi_approx<long_double>(__return_storage_ptr__,x * (longdouble)0.5);
  in_ST0 = _DAT_002ad260 * in_ST0;
  uStack_20 = (ushort)((unkuint10)in_ST0 >> 0x40);
  local_28 = SUB108(in_ST0,0);
  bVar3 = ((unkuint10)in_ST0 & 0x7fff) != 0;
  uVar1 = (ulong)CONCAT31((int3)((uStack_20 & 0x7fff) >> 8),bVar3);
  if (!bVar3 || ((uStack_20 & 0x7fff) - 1 & 0xffff) < 0x7ffe && local_28 < 0) {
    erfcl();
    lVar4 = _DAT_002ad270 * (in_ST1 - x);
    uVar1 = expl();
    lVar4 = lVar4 * in_ST2;
    in_ST0 = in_ST0 - lVar4 / (in_ST0 * lVar4 + (longdouble)1);
  }
  local_38 = SUB108(in_ST0,0);
  uStack_30 = (ushort)((unkuint10)in_ST0 >> 0x40);
  bVar3 = ((unkuint10)in_ST0 & 0x7fff) != 0;
  plVar2 = (longdouble *)CONCAT71((int7)(uVar1 >> 8),bVar3);
  if (!bVar3 || (ushort)((uStack_30 & 0x7fff) - 1) < 0x7ffe && local_38 < 0) {
    erfcl();
    plVar2 = (longdouble *)expl();
  }
  return plVar2;
}

Assistant:

TRNG_CUDA_ENABLE T inv_erfc(T x) {
        // step size in the Halley step is proportional to erfc, use symmetry to increase
        // numerical accuracy
        const bool flag{x > 1};
        if (flag)
          x = -(x - 1) + 1;
        T y{-inv_Phi_approx(x / 2) * constants<T>::one_over_sqrt_2};
        // refinement by Halley rational method
        if (isfinite(y)) {
          const T e{erfc(y) - x};
          const T u{-e * (constants<T>::sqrt_pi_over_2) * exp(y * y)};
          y -= u / (1 + y * u);
        }
        // T is a floating point number type with more than 80 bits, a 2nd iteration is
        // required to reach full machine precision
#if __cplusplus >= 201703L
        if constexpr (sizeof(T) > 10) {
#else
#if _MSC_VER
#pragma warning(push)
#pragma warning(disable : 4127)
#endif
        if (sizeof(T) > 10) {
#if _MSC_VER
#pragma warning(pop)
#endif
#endif
          if (isfinite(y)) {
            const T e{erfc(y) - x};
            const T u{-e * (constants<T>::sqrt_pi_over_2) * exp(y * y)};
            y -= u / (1 + y * u);
          }
        }
        return flag ? -y : y;
      }

    }